

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noisy_laser_tag.cpp
# Opt level: O1

double __thiscall despot::NoisyLaserTag::LaserRange(NoisyLaserTag *this,State *state,int dir)

{
  int iVar1;
  byte bVar2;
  int iVar3;
  long lVar4;
  int *piVar5;
  int iVar6;
  double dVar7;
  Coord coord;
  Coord opp;
  Coord rob;
  undefined8 local_58;
  double local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  iVar6 = (int)this + 0x58;
  local_38 = despot::Floor::GetCell(iVar6);
  local_40 = despot::Floor::GetCell(iVar6);
  iVar6 = 1;
  do {
    local_48 = despot::Coord::operator*((Coord *)(&Compass::DIRECTIONS + dir),iVar6);
    lVar4 = despot::operator+((Coord *)&local_38,(Coord *)&local_48);
    iVar3 = (int)lVar4;
    piVar5 = (int *)&Floor::INVALID;
    if (-1 < (long)iVar3) {
      local_58._4_4_ = (uint)((ulong)lVar4 >> 0x20);
      piVar5 = (int *)&Floor::INVALID;
      if (((-1 < lVar4) &&
          (piVar5 = (int *)&Floor::INVALID, iVar3 < (this->super_BaseTag).floor_.num_cols_)) &&
         (piVar5 = (int *)&Floor::INVALID,
         (int)local_58._4_4_ < (this->super_BaseTag).floor_.num_rows_)) {
        piVar5 = (this->super_BaseTag).floor_.floor_[local_58._4_4_] + iVar3;
      }
    }
    local_58 = lVar4;
    if (*piVar5 == -1) {
      bVar2 = 0;
    }
    else {
      bVar2 = despot::operator==((Coord *)&local_58,(Coord *)&local_40);
      bVar2 = bVar2 ^ 1;
      iVar6 = iVar6 + (uint)bVar2;
    }
  } while (bVar2 != 0);
  iVar3 = *(int *)(&Compass::DIRECTIONS + dir);
  iVar1 = *(int *)((long)&Compass::DIRECTIONS + (long)dir * 8 + 4);
  local_50 = (double)iVar6;
  dVar7 = (double)(iVar1 * iVar1 + iVar3 * iVar3);
  if (dVar7 < 0.0) {
    dVar7 = sqrt(dVar7);
  }
  else {
    dVar7 = SQRT(dVar7);
  }
  return dVar7 * local_50;
}

Assistant:

double NoisyLaserTag::LaserRange(const State& state, int dir) const {
	Coord rob = floor_.GetCell(rob_[state.state_id]), opp = floor_.GetCell(
		opp_[state.state_id]);
	int d = 1;
	while (true) {
		Coord coord = rob + Compass::DIRECTIONS[dir] * d;
		if (floor_.GetIndex(coord) == -1 || coord == opp)
			break;
		d++;
	}
	int x = Compass::DIRECTIONS[dir].x, y = Compass::DIRECTIONS[dir].y;

	return d * sqrt(x * x + y * y);
}